

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  uint *puVar4;
  void *pvVar5;
  undefined4 *puVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  float *ptr;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  undefined1 (*pauVar24) [32];
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  int iVar27;
  long lVar28;
  undefined1 (*pauVar29) [32];
  uint uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [28];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  
  auVar8 = _DAT_005a56e0;
  auVar7 = _DAT_005a56c0;
  iVar18 = bottom_top_blob->elempack;
  iVar21 = bottom_top_blob->dims;
  iVar27 = bottom_top_blob->w;
  uVar23 = bottom_top_blob->h;
  auVar35 = in_ZMM5._0_16_;
  if (iVar21 == 3) {
    uVar19 = bottom_top_blob->c;
    if (0 < (int)uVar19) {
      uVar23 = iVar27 * iVar18 * uVar23;
      uVar25 = 0;
      auVar49 = ZEXT816(0);
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      auVar35 = vpcmpeqd_avx(auVar35,auVar35);
      auVar38._8_4_ = 0xffff;
      auVar38._0_8_ = 0xffff0000ffff;
      auVar38._12_4_ = 0xffff;
      auVar38._16_4_ = 0xffff;
      auVar38._20_4_ = 0xffff;
      auVar38._24_4_ = 0xffff;
      auVar38._28_4_ = 0xffff;
      do {
        puVar6 = (undefined4 *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          uVar3 = *puVar6;
          auVar68._4_4_ = uVar3;
          auVar68._0_4_ = uVar3;
          auVar68._8_4_ = uVar3;
          auVar68._12_4_ = uVar3;
          auVar42 = auVar68;
LAB_003204d7:
          auVar32 = auVar42;
          auVar45._16_16_ = auVar68;
          auVar45._0_16_ = auVar68;
          auVar43 = auVar45._0_28_;
        }
        else {
          uVar30 = puVar6[uVar25];
          auVar32 = ZEXT416(uVar30);
          auVar42 = ZEXT416(uVar30);
          if (iVar18 == 4) {
            auVar68 = *(undefined1 (*) [16])(puVar6 + uVar25 * 4);
            goto LAB_003204d7;
          }
          auVar68 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
          if (iVar18 != 8) goto LAB_003204d7;
          auVar43 = SUB3228(*(undefined1 (*) [32])(puVar6 + uVar25 * 8),0);
        }
        pauVar29 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar25 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar30 = 0;
        if (7 < (int)uVar23) {
          iVar21 = 7;
          do {
            auVar45 = vmaxps_avx(*pauVar29,ZEXT1632(auVar49));
            auVar61 = vminps_avx(*pauVar29,ZEXT1632(auVar49));
            auVar51._0_4_ = auVar61._0_4_ * auVar43._0_4_ + auVar45._0_4_;
            auVar51._4_4_ = auVar61._4_4_ * auVar43._4_4_ + auVar45._4_4_;
            auVar51._8_4_ = auVar61._8_4_ * auVar43._8_4_ + auVar45._8_4_;
            auVar51._12_4_ = auVar61._12_4_ * auVar43._12_4_ + auVar45._12_4_;
            auVar51._16_4_ = auVar61._16_4_ * auVar43._16_4_ + auVar45._16_4_;
            auVar51._20_4_ = auVar61._20_4_ * auVar43._20_4_ + auVar45._20_4_;
            auVar51._24_4_ = auVar61._24_4_ * auVar43._24_4_ + auVar45._24_4_;
            auVar51._28_4_ = auVar61._28_4_ + auVar45._28_4_;
            *pauVar29 = auVar51;
            pauVar29 = pauVar29 + 1;
            iVar21 = iVar21 + 8;
            uVar30 = uVar23 & 0xfffffff8;
          } while (iVar21 < (int)uVar23);
        }
        uVar22 = uVar30 | 3;
        while ((int)uVar22 < (int)uVar23) {
          auVar42 = vmaxps_avx(*(undefined1 (*) [16])*pauVar29,ZEXT816(0));
          auVar40 = vminps_avx(*(undefined1 (*) [16])*pauVar29,ZEXT816(0));
          *(float *)*pauVar29 = auVar40._0_4_ * auVar68._0_4_ + auVar42._0_4_;
          *(float *)(*pauVar29 + 4) = auVar40._4_4_ * auVar68._4_4_ + auVar42._4_4_;
          *(float *)(*pauVar29 + 8) = auVar40._8_4_ * auVar68._8_4_ + auVar42._8_4_;
          *(float *)(*pauVar29 + 0xc) = auVar40._12_4_ * auVar68._12_4_ + auVar42._12_4_;
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
          uVar22 = uVar30 + 7;
          uVar30 = uVar30 + 4;
        }
        if ((int)uVar30 < (int)uVar23) {
          uVar20 = CONCAT44(0,~uVar30 + uVar23);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar20;
          auVar40 = vpshufd_avx(auVar42,0x44);
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          auVar68 = vorps_avx(auVar40,auVar33);
          auVar42 = vorps_avx(auVar40,auVar33);
          uVar31 = 0;
          do {
            auVar56._8_8_ = 0;
            auVar56._0_8_ = uVar31;
            auVar56 = vpshufd_avx(auVar56,0x44);
            auVar61._16_16_ = auVar56;
            auVar61._0_16_ = auVar56;
            auVar45 = vorps_avx(auVar61,auVar7);
            auVar61 = vorps_avx(auVar61,auVar8);
            auVar56 = vorps_avx(auVar40,auVar33);
            auVar71._0_8_ = auVar61._16_8_ ^ 0x8000000000000000;
            auVar71._8_4_ = auVar61._24_4_;
            auVar71._12_4_ = auVar61._28_4_ ^ 0x80000000;
            auVar71 = vpcmpgtq_avx(auVar71,auVar56);
            auVar57._0_8_ = auVar61._0_8_ ^ 0x8000000000000000;
            auVar57._8_4_ = auVar61._8_4_;
            auVar57._12_4_ = auVar61._12_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar57,auVar68);
            auVar71 = vpackssdw_avx(auVar57,auVar71);
            auVar74._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
            auVar74._8_4_ = auVar45._24_4_;
            auVar74._12_4_ = auVar45._28_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar74,auVar56);
            auVar65._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
            auVar65._8_4_ = auVar45._8_4_;
            auVar65._12_4_ = auVar45._12_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar65,auVar42);
            auVar56 = vpackssdw_avx(auVar57,auVar56);
            auVar56 = vpackssdw_avx(auVar56 ^ auVar35,auVar71 ^ auVar35);
            auVar71 = vpmovsxwd_avx(auVar56);
            auVar57 = vpunpckhwd_avx(auVar56,auVar56);
            auVar70._16_16_ = auVar57;
            auVar70._0_16_ = auVar71;
            auVar61 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])(*pauVar29 + uVar31 * 4));
            auVar45 = vcmpps_avx(auVar61,ZEXT1632(auVar49),1);
            auVar45 = vandps_avx(auVar45,auVar38);
            auVar71 = vpackusdw_avx(auVar45._0_16_,auVar45._16_16_);
            auVar56 = vpand_avx(auVar56,auVar71);
            auVar71 = vpmovzxwd_avx(auVar56);
            auVar71 = vpslld_avx(auVar71,0x1f);
            auVar56 = vpunpckhwd_avx(auVar56,auVar56);
            auVar56 = vpslld_avx(auVar56,0x1f);
            auVar62._16_16_ = auVar56;
            auVar62._0_16_ = auVar71;
            auVar10._4_4_ = auVar61._4_4_ * auVar32._4_4_;
            auVar10._0_4_ = auVar61._0_4_ * auVar32._0_4_;
            auVar10._8_4_ = auVar61._8_4_ * auVar32._8_4_;
            auVar10._12_4_ = auVar61._12_4_ * auVar32._12_4_;
            auVar10._16_4_ = auVar61._16_4_ * auVar32._0_4_;
            auVar10._20_4_ = auVar61._20_4_ * auVar32._4_4_;
            auVar10._24_4_ = auVar61._24_4_ * auVar32._8_4_;
            auVar10._28_4_ = auVar61._28_4_;
            auVar45 = vmaskmovps_avx(auVar62,auVar10);
            *(undefined1 (*) [32])(*pauVar29 + uVar31 * 4) = auVar45;
            uVar31 = uVar31 + 8;
          } while ((uVar20 + 8 & 0x1fffffff8) != uVar31);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar19);
    }
  }
  else if (iVar21 == 2) {
    if (0 < (int)uVar23) {
      uVar19 = iVar27 * iVar18;
      uVar25 = 0;
      auVar49 = ZEXT816(0);
      auVar32._8_8_ = 0x8000000000000000;
      auVar32._0_8_ = 0x8000000000000000;
      auVar35 = vpcmpeqd_avx(auVar35,auVar35);
      auVar37._8_4_ = 0xffff;
      auVar37._0_8_ = 0xffff0000ffff;
      auVar37._12_4_ = 0xffff;
      auVar37._16_4_ = 0xffff;
      auVar37._20_4_ = 0xffff;
      auVar37._24_4_ = 0xffff;
      auVar37._28_4_ = 0xffff;
      do {
        puVar6 = (undefined4 *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          uVar3 = *puVar6;
          auVar40._4_4_ = uVar3;
          auVar40._0_4_ = uVar3;
          auVar40._8_4_ = uVar3;
          auVar40._12_4_ = uVar3;
          auVar33 = auVar40;
LAB_0032028b:
          auVar68 = auVar33;
          auVar44._16_16_ = auVar40;
          auVar44._0_16_ = auVar40;
          auVar43 = auVar44._0_28_;
        }
        else {
          uVar30 = puVar6[uVar25];
          auVar68 = ZEXT416(uVar30);
          auVar33 = ZEXT416(uVar30);
          if (iVar18 == 4) {
            auVar40 = *(undefined1 (*) [16])(puVar6 + uVar25 * 4);
            goto LAB_0032028b;
          }
          auVar40 = vshufps_avx(ZEXT416(uVar30),ZEXT416(uVar30),0);
          if (iVar18 != 8) goto LAB_0032028b;
          auVar43 = SUB3228(*(undefined1 (*) [32])(puVar6 + uVar25 * 8),0);
        }
        pauVar29 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar25 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar30 = 0;
        if (7 < (int)uVar19) {
          iVar21 = 7;
          do {
            auVar38 = vmaxps_avx(*pauVar29,ZEXT1632(auVar49));
            auVar45 = vminps_avx(*pauVar29,ZEXT1632(auVar49));
            auVar50._0_4_ = auVar45._0_4_ * auVar43._0_4_ + auVar38._0_4_;
            auVar50._4_4_ = auVar45._4_4_ * auVar43._4_4_ + auVar38._4_4_;
            auVar50._8_4_ = auVar45._8_4_ * auVar43._8_4_ + auVar38._8_4_;
            auVar50._12_4_ = auVar45._12_4_ * auVar43._12_4_ + auVar38._12_4_;
            auVar50._16_4_ = auVar45._16_4_ * auVar43._16_4_ + auVar38._16_4_;
            auVar50._20_4_ = auVar45._20_4_ * auVar43._20_4_ + auVar38._20_4_;
            auVar50._24_4_ = auVar45._24_4_ * auVar43._24_4_ + auVar38._24_4_;
            auVar50._28_4_ = auVar45._28_4_ + auVar38._28_4_;
            *pauVar29 = auVar50;
            pauVar29 = pauVar29 + 1;
            iVar21 = iVar21 + 8;
            uVar30 = uVar19 & 0xfffffff8;
          } while (iVar21 < (int)uVar19);
        }
        uVar22 = uVar30 | 3;
        while ((int)uVar22 < (int)uVar19) {
          auVar33 = vmaxps_avx(*(undefined1 (*) [16])*pauVar29,ZEXT816(0));
          auVar42 = vminps_avx(*(undefined1 (*) [16])*pauVar29,ZEXT816(0));
          *(float *)*pauVar29 = auVar42._0_4_ * auVar40._0_4_ + auVar33._0_4_;
          *(float *)(*pauVar29 + 4) = auVar42._4_4_ * auVar40._4_4_ + auVar33._4_4_;
          *(float *)(*pauVar29 + 8) = auVar42._8_4_ * auVar40._8_4_ + auVar33._8_4_;
          *(float *)(*pauVar29 + 0xc) = auVar42._12_4_ * auVar40._12_4_ + auVar33._12_4_;
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
          uVar22 = uVar30 + 7;
          uVar30 = uVar30 + 4;
        }
        if ((int)uVar30 < (int)uVar19) {
          uVar20 = CONCAT44(0,~uVar30 + uVar19);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar20;
          auVar42 = vpshufd_avx(auVar41,0x44);
          auVar40 = vshufps_avx(auVar68,auVar68,0);
          auVar33 = vorps_avx(auVar42,auVar32);
          auVar68 = vorps_avx(auVar42,auVar32);
          uVar31 = 0;
          do {
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar31;
            auVar56 = vpshufd_avx(auVar54,0x44);
            auVar59._16_16_ = auVar56;
            auVar59._0_16_ = auVar56;
            auVar38 = vorps_avx(auVar59,auVar7);
            auVar45 = vorps_avx(auVar59,auVar8);
            auVar56 = vorps_avx(auVar42,auVar32);
            auVar72._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
            auVar72._8_4_ = auVar45._24_4_;
            auVar72._12_4_ = auVar45._28_4_ ^ 0x80000000;
            auVar71 = vpcmpgtq_avx(auVar72,auVar56);
            auVar55._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
            auVar55._8_4_ = auVar45._8_4_;
            auVar55._12_4_ = auVar45._12_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar55,auVar33);
            auVar71 = vpackssdw_avx(auVar57,auVar71);
            auVar73._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
            auVar73._8_4_ = auVar38._24_4_;
            auVar73._12_4_ = auVar38._28_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar73,auVar56);
            auVar64._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
            auVar64._8_4_ = auVar38._8_4_;
            auVar64._12_4_ = auVar38._12_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar64,auVar68);
            auVar56 = vpackssdw_avx(auVar57,auVar56);
            auVar56 = vpackssdw_avx(auVar56 ^ auVar35,auVar71 ^ auVar35);
            auVar71 = vpmovsxwd_avx(auVar56);
            auVar57 = vpunpckhwd_avx(auVar56,auVar56);
            auVar69._16_16_ = auVar57;
            auVar69._0_16_ = auVar71;
            auVar45 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(*pauVar29 + uVar31 * 4));
            auVar38 = vcmpps_avx(auVar45,ZEXT1632(auVar49),1);
            auVar38 = vandps_avx(auVar38,auVar37);
            auVar71 = vpackusdw_avx(auVar38._0_16_,auVar38._16_16_);
            auVar56 = vpand_avx(auVar56,auVar71);
            auVar71 = vpmovzxwd_avx(auVar56);
            auVar71 = vpslld_avx(auVar71,0x1f);
            auVar56 = vpunpckhwd_avx(auVar56,auVar56);
            auVar56 = vpslld_avx(auVar56,0x1f);
            auVar60._16_16_ = auVar56;
            auVar60._0_16_ = auVar71;
            auVar9._4_4_ = auVar45._4_4_ * auVar40._4_4_;
            auVar9._0_4_ = auVar45._0_4_ * auVar40._0_4_;
            auVar9._8_4_ = auVar45._8_4_ * auVar40._8_4_;
            auVar9._12_4_ = auVar45._12_4_ * auVar40._12_4_;
            auVar9._16_4_ = auVar45._16_4_ * auVar40._0_4_;
            auVar9._20_4_ = auVar45._20_4_ * auVar40._4_4_;
            auVar9._24_4_ = auVar45._24_4_ * auVar40._8_4_;
            auVar9._28_4_ = auVar45._28_4_;
            auVar38 = vmaskmovps_avx(auVar60,auVar9);
            *(undefined1 (*) [32])(*pauVar29 + uVar31 * 4) = auVar38;
            uVar31 = uVar31 + 8;
          } while ((uVar20 + 8 & 0x1fffffff8) != uVar31);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar23);
    }
  }
  else if (iVar21 == 1) {
    iVar18 = iVar18 * iVar27;
    pauVar29 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar4 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      uVar23 = *puVar4;
      iVar21 = iVar18 + 7;
      if (-1 < iVar18) {
        iVar21 = iVar18;
      }
      uVar19 = iVar21 >> 3;
      if (7 < iVar18) {
        auVar35 = vshufps_avx(ZEXT416(uVar23),ZEXT416(uVar23),0);
        uVar25 = (ulong)uVar19;
        pauVar24 = pauVar29;
        do {
          auVar7 = vmaxps_avx(*pauVar24,ZEXT1632(ZEXT816(0) << 0x40));
          auVar8 = vminps_avx(*pauVar24,ZEXT1632(ZEXT816(0) << 0x40));
          *(float *)*pauVar24 = auVar8._0_4_ * auVar35._0_4_ + auVar7._0_4_;
          *(float *)(*pauVar24 + 4) = auVar8._4_4_ * auVar35._4_4_ + auVar7._4_4_;
          *(float *)(*pauVar24 + 8) = auVar8._8_4_ * auVar35._8_4_ + auVar7._8_4_;
          *(float *)(*pauVar24 + 0xc) = auVar8._12_4_ * auVar35._12_4_ + auVar7._12_4_;
          *(float *)(*pauVar24 + 0x10) = auVar8._16_4_ * auVar35._0_4_ + auVar7._16_4_;
          *(float *)(*pauVar24 + 0x14) = auVar8._20_4_ * auVar35._4_4_ + auVar7._20_4_;
          *(float *)(*pauVar24 + 0x18) = auVar8._24_4_ * auVar35._8_4_ + auVar7._24_4_;
          *(float *)(*pauVar24 + 0x1c) = auVar8._28_4_ + auVar7._28_4_;
          pauVar24 = pauVar24 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      iVar27 = iVar18 + uVar19 * -8;
      iVar21 = iVar27 + 3;
      if (-1 < iVar27) {
        iVar21 = iVar27;
      }
      auVar35 = ZEXT416(uVar23);
      if (3 < iVar27) {
        auVar49 = vshufps_avx(auVar35,auVar35,0);
        uVar25 = (ulong)(uint)(iVar21 >> 2);
        pauVar26 = (undefined1 (*) [16])(*pauVar29 + (long)(int)(uVar19 * 8) * 4);
        do {
          auVar33 = vmaxps_avx(*pauVar26,ZEXT816(0) << 0x40);
          auVar68 = vminps_avx(*pauVar26,ZEXT816(0) << 0x40);
          *(float *)*pauVar26 = auVar68._0_4_ * auVar49._0_4_ + auVar33._0_4_;
          *(float *)(*pauVar26 + 4) = auVar68._4_4_ * auVar49._4_4_ + auVar33._4_4_;
          *(float *)(*pauVar26 + 8) = auVar68._8_4_ * auVar49._8_4_ + auVar33._8_4_;
          *(float *)(*pauVar26 + 0xc) = auVar68._12_4_ * auVar49._12_4_ + auVar33._12_4_;
          pauVar26 = pauVar26 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      auVar8 = _DAT_005a56e0;
      auVar7 = _DAT_005a56c0;
      iVar21 = uVar19 * 8 + (iVar21 >> 2) * 4;
      if (iVar21 < iVar18) {
        lVar28 = (long)iVar21;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = (iVar18 - lVar28) - 1;
        auVar49 = vpshufd_avx(auVar49,0x44);
        auVar33 = vshufps_avx(auVar35,auVar35,0);
        uVar20 = 0;
        uVar25 = auVar49._0_8_;
        auVar34._0_8_ = uVar25 ^ 0x8000000000000000;
        auVar34._8_4_ = auVar49._8_4_;
        uVar23 = auVar49._12_4_;
        auVar34._12_4_ = uVar23 ^ 0x80000000;
        auVar36._0_8_ = uVar25 ^ 0x8000000000000000;
        auVar36._8_4_ = auVar34._8_4_;
        auVar36._12_4_ = uVar23 ^ 0x80000000;
        auVar35 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar39._0_8_ = uVar25 ^ 0x8000000000000000;
        auVar39._8_4_ = auVar34._8_4_;
        auVar39._12_4_ = uVar23 ^ 0x80000000;
        auVar46._8_4_ = 0xffff;
        auVar46._0_8_ = 0xffff0000ffff;
        auVar46._12_4_ = 0xffff;
        auVar46._16_4_ = 0xffff;
        auVar46._20_4_ = 0xffff;
        auVar46._24_4_ = 0xffff;
        auVar46._28_4_ = 0xffff;
        do {
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar20;
          auVar49 = vpshufd_avx(auVar47,0x44);
          auVar52._16_16_ = auVar49;
          auVar52._0_16_ = auVar49;
          auVar38 = vorps_avx(auVar52,auVar7);
          auVar45 = vorps_avx(auVar52,auVar8);
          auVar66._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
          auVar66._8_4_ = auVar45._24_4_;
          auVar66._12_4_ = auVar45._28_4_ ^ 0x80000000;
          auVar49 = vpcmpgtq_avx(auVar66,auVar34);
          auVar48._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar45._8_4_;
          auVar48._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar48,auVar36);
          auVar49 = vpackssdw_avx(auVar68,auVar49);
          auVar67._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
          auVar67._8_4_ = auVar38._24_4_;
          auVar67._12_4_ = auVar38._28_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar67,auVar34);
          auVar58._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
          auVar58._8_4_ = auVar38._8_4_;
          auVar58._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar42 = vpcmpgtq_avx(auVar58,auVar39);
          auVar68 = vpackssdw_avx(auVar42,auVar68);
          auVar49 = vpackssdw_avx(auVar68 ^ auVar35,auVar49 ^ auVar35);
          auVar68 = vpmovsxwd_avx(auVar49);
          auVar42 = vpunpckhwd_avx(auVar49,auVar49);
          auVar63._16_16_ = auVar42;
          auVar63._0_16_ = auVar68;
          auVar45 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])
                                            (*pauVar29 + uVar20 * 4 + lVar28 * 4));
          auVar38 = vcmpps_avx(auVar45,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar38 = vandps_avx(auVar38,auVar46);
          auVar68 = vpackusdw_avx(auVar38._0_16_,auVar38._16_16_);
          auVar49 = vpand_avx(auVar49,auVar68);
          auVar68 = vpmovzxwd_avx(auVar49);
          auVar68 = vpslld_avx(auVar68,0x1f);
          auVar49 = vpunpckhwd_avx(auVar49,auVar49);
          auVar49 = vpslld_avx(auVar49,0x1f);
          auVar53._16_16_ = auVar49;
          auVar53._0_16_ = auVar68;
          auVar11._4_4_ = auVar45._4_4_ * auVar33._4_4_;
          auVar11._0_4_ = auVar45._0_4_ * auVar33._0_4_;
          auVar11._8_4_ = auVar45._8_4_ * auVar33._8_4_;
          auVar11._12_4_ = auVar45._12_4_ * auVar33._12_4_;
          auVar11._16_4_ = auVar45._16_4_ * auVar33._0_4_;
          auVar11._20_4_ = auVar45._20_4_ * auVar33._4_4_;
          auVar11._24_4_ = auVar45._24_4_ * auVar33._8_4_;
          auVar11._28_4_ = auVar45._28_4_;
          auVar38 = vmaskmovps_avx(auVar53,auVar11);
          *(undefined1 (*) [32])(*pauVar29 + uVar20 * 4 + lVar28 * 4) = auVar38;
          uVar20 = uVar20 + 8;
        } while (((iVar18 - lVar28) + 7U & 0xfffffffffffffff8) != uVar20);
      }
    }
    else {
      iVar21 = iVar18 + 7;
      if (-1 < iVar18) {
        iVar21 = iVar18;
      }
      uVar23 = iVar21 >> 3;
      if (7 < iVar18) {
        uVar25 = (ulong)uVar23;
        lVar28 = 0;
        do {
          auVar7 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar29 + lVar28),ZEXT1632(ZEXT816(0)));
          auVar8 = vminps_avx(*(undefined1 (*) [32])(*pauVar29 + lVar28),ZEXT1632(ZEXT816(0)));
          pfVar1 = (float *)((long)puVar4 + lVar28);
          fVar12 = pfVar1[1];
          fVar13 = pfVar1[2];
          fVar14 = pfVar1[3];
          fVar15 = pfVar1[4];
          fVar16 = pfVar1[5];
          fVar17 = pfVar1[6];
          pfVar2 = (float *)(*pauVar29 + lVar28);
          *pfVar2 = auVar8._0_4_ * *pfVar1 + auVar7._0_4_;
          pfVar2[1] = auVar8._4_4_ * fVar12 + auVar7._4_4_;
          pfVar2[2] = auVar8._8_4_ * fVar13 + auVar7._8_4_;
          pfVar2[3] = auVar8._12_4_ * fVar14 + auVar7._12_4_;
          pfVar2[4] = auVar8._16_4_ * fVar15 + auVar7._16_4_;
          pfVar2[5] = auVar8._20_4_ * fVar16 + auVar7._20_4_;
          pfVar2[6] = auVar8._24_4_ * fVar17 + auVar7._24_4_;
          pfVar2[7] = auVar8._28_4_ + auVar7._28_4_;
          lVar28 = lVar28 + 0x20;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      iVar27 = iVar18 + uVar23 * -8;
      iVar21 = iVar27 + 3;
      if (-1 < iVar27) {
        iVar21 = iVar27;
      }
      if (3 < iVar27) {
        uVar25 = (ulong)(uint)(iVar21 >> 2);
        lVar28 = (long)(int)(uVar23 * 8) << 2;
        do {
          auVar35 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar29 + lVar28),ZEXT816(0) << 0x40);
          auVar49 = vminps_avx(*(undefined1 (*) [16])(*pauVar29 + lVar28),ZEXT816(0) << 0x40);
          pfVar1 = (float *)((long)puVar4 + lVar28);
          fVar12 = pfVar1[1];
          fVar13 = pfVar1[2];
          fVar14 = pfVar1[3];
          pfVar2 = (float *)(*pauVar29 + lVar28);
          *pfVar2 = auVar49._0_4_ * *pfVar1 + auVar35._0_4_;
          pfVar2[1] = auVar49._4_4_ * fVar12 + auVar35._4_4_;
          pfVar2[2] = auVar49._8_4_ * fVar13 + auVar35._8_4_;
          pfVar2[3] = auVar49._12_4_ * fVar14 + auVar35._12_4_;
          lVar28 = lVar28 + 0x10;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      iVar21 = uVar23 * 8 + (iVar21 >> 2) * 4;
      if (iVar21 < iVar18) {
        pvVar5 = (this->super_PReLU).slope_data.data;
        lVar28 = (long)iVar21;
        do {
          if (*(float *)(*pauVar29 + lVar28 * 4) < 0.0) {
            *(float *)(*pauVar29 + lVar28 * 4) =
                 *(float *)(*pauVar29 + lVar28 * 4) * *(float *)((long)pvVar5 + lVar28 * 4);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < iVar18);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}